

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O2

Status __thiscall
leveldb::anon_unknown_1::PosixEnv::NewSequentialFile
          (PosixEnv *this,string *filename,SequentialFile **result)

{
  int iVar1;
  undefined8 *puVar2;
  int *piVar3;
  undefined8 *in_RCX;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = open((char *)*result,0x80000);
  if (iVar1 < 0) {
    *in_RCX = 0;
    piVar3 = __errno_location();
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      PosixError((anon_unknown_1 *)this,(string *)result,*piVar3);
      return (Status)(char *)this;
    }
  }
  else {
    puVar2 = (undefined8 *)operator_new(0x30);
    std::__cxx11::string::string
              ((string *)&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)result);
    *puVar2 = &PTR__PosixSequentialFile_00a28e90;
    *(int *)(puVar2 + 1) = iVar1;
    std::__cxx11::string::string((string *)(puVar2 + 2),&local_50);
    *in_RCX = puVar2;
    std::__cxx11::string::~string((string *)&local_50);
    (this->super_Env)._vptr_Env = (_func_int **)0x0;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return (Status)(char *)this;
    }
  }
  __stack_chk_fail();
}

Assistant:

Status NewSequentialFile(const std::string& filename,
                           SequentialFile** result) override {
    int fd = ::open(filename.c_str(), O_RDONLY | kOpenBaseFlags);
    if (fd < 0) {
      *result = nullptr;
      return PosixError(filename, errno);
    }

    *result = new PosixSequentialFile(filename, fd);
    return Status::OK();
  }